

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O3

CodeLocation __thiscall soul::CodeLocation::getStartOfPreviousLine(CodeLocation *this)

{
  UTF8Reader extraout_RDX;
  long *in_RSI;
  CodeLocation CVar1;
  CodeLocation l;
  CodeLocation local_28;
  
  getStartOfLine(&local_28);
  if (local_28.location.data != (char *)0x0) {
    if (*in_RSI == 0) {
      throwInternalCompilerError("object != nullptr","operator->",0x47);
    }
    if (*(char **)(*in_RSI + 0x48) < local_28.location.data) {
      local_28.location.data = local_28.location.data + -1;
      getStartOfLine(this);
      goto LAB_001aec1e;
    }
  }
  (this->sourceCode).object = (SourceCodeText *)0x0;
  (this->location).data = (char *)0x0;
LAB_001aec1e:
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_28.sourceCode.object);
  CVar1.location.data = extraout_RDX.data;
  CVar1.sourceCode.object = (SourceCodeText *)this;
  return CVar1;
}

Assistant:

CodeLocation CodeLocation::getStartOfPreviousLine() const
{
    auto l = getStartOfLine();

    if (l.location.getAddress() == nullptr)
        return {};

    if (l.location <= sourceCode->utf8)
        return {};

    --(l.location);
    return l.getStartOfLine();
}